

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::enteringExecMode(TimeCoordinator *this,IterationRequest mode)

{
  TimeDependencies *this_00;
  _Alloc_hider __src;
  int iVar1;
  DependencyInfo *pDVar2;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage execreq;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  ActionMessage local_d0;
  
  if ((this->super_BaseTimeCoordinator).executionMode == false) {
    this->iterating = mode;
    this_00 = &(this->super_BaseTimeCoordinator).dependencies;
    TimeDependencies::checkForIssues_abi_cxx11_
              (&local_f8,this_00,(this->info).wait_for_current_time_updates);
    if (local_f8.first == 0) {
      BaseTimeCoordinator::sendTimingInfo(&this->super_BaseTimeCoordinator);
      (this->super_BaseTimeCoordinator).checkingExec = true;
      ActionMessage::ActionMessage(&local_d0,cmd_exec_request);
      local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      if (this->iterating != NO_ITERATIONS) {
        setIterationFlags(&local_d0,this->iterating);
        iVar1 = (this->super_BaseTimeCoordinator).sequenceCounter + 1;
        (this->super_BaseTimeCoordinator).sequenceCounter = iVar1;
        local_d0.counter = (uint16_t)iVar1;
        if (this->hasInitUpdates == false) {
          pDVar2 = getExecEntryMinFederate
                             (this_00,(GlobalFederateId)
                                      (this->super_BaseTimeCoordinator).mSourceId.gid,NONE,
                              (GlobalFederateId)0x8831d580);
          local_d0.dest_handle.hid = (pDVar2->fedID).gid;
        }
      }
      if ((this->info).wait_for_current_time_updates == true) {
        local_d0.flags._1_1_ = local_d0.flags._1_1_ | 4;
      }
      transmitTimingMessages(this,&local_d0,(GlobalFederateId)0x8831d580);
    }
    else {
      ActionMessage::ActionMessage(&local_d0,cmd_global_error);
      __src._M_p = local_f8.second._M_dataplus._M_p;
      local_d0.dest_id.gid = 0;
      local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      local_d0.messageID = local_f8.first;
      if ((byte *)local_f8.second._M_dataplus._M_p == local_d0.payload.heap) {
        local_d0.payload.bufferSize = local_f8.second._M_string_length;
      }
      else {
        SmallBuffer::reserve(&local_d0.payload,local_f8.second._M_string_length);
        local_d0.payload.bufferSize = local_f8.second._M_string_length;
        if (local_f8.second._M_string_length != 0) {
          memcpy(local_d0.payload.heap,__src._M_p,local_f8.second._M_string_length);
        }
      }
      if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
    }
    ActionMessage::~ActionMessage(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.second._M_dataplus._M_p != &local_f8.second.field_2) {
      operator_delete(local_f8.second._M_dataplus._M_p,
                      local_f8.second.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TimeCoordinator::enteringExecMode(IterationRequest mode)
{
    if (executionMode) {
        return;
    }
    iterating = mode;
    auto res = dependencies.checkForIssues(info.wait_for_current_time_updates);
    if (res.first != 0) {
        ActionMessage ge(CMD_GLOBAL_ERROR);
        ge.dest_id = parent_broker_id;
        ge.source_id = mSourceId;
        ge.messageID = res.first;
        ge.payload = res.second;
        sendMessageFunction(ge);
        return;
    }
    sendTimingInfo();
    checkingExec = true;
    ActionMessage execreq(CMD_EXEC_REQUEST);

    execreq.source_id = mSourceId;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(execreq, iterating);
        ++sequenceCounter;
        execreq.counter = sequenceCounter;
        if (!hasInitUpdates) {
            const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
            execreq.setExtraData(mfed.fedID.baseValue());
        }
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(execreq, delayed_timing_flag);
    }
    transmitTimingMessages(execreq);
}